

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_2_5::anon_unknown_18::twoSidedJacobiRotation<double>
               (Matrix44<double> *A,int j,int k,Matrix44<double> *U,Matrix44<double> *V,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double *pdVar5;
  int in_EDX;
  int in_ESI;
  int __x;
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar6;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Matrix44<double> *extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar7;
  double dVar8;
  double s_00;
  double dVar9;
  double tau2_1;
  double tau1_1;
  int l_1;
  double tau2;
  double tau1;
  int l;
  double d_2;
  double d_1;
  double s_1;
  double c_1;
  double t_2;
  double rho_2;
  double s_2;
  double c_2;
  double rho;
  double r;
  double p;
  double s;
  double c;
  double mu_2;
  double mu_1;
  bool changed;
  double z;
  double y;
  double x;
  double w;
  double in_stack_fffffffffffffed8;
  int local_ec;
  int local_d4;
  double local_b0;
  double local_a0;
  double local_98;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  bool local_1;
  
  pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
  dVar9 = pdVar5[in_ESI];
  pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
  dVar1 = pdVar5[in_EDX];
  pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
  dVar2 = pdVar5[in_ESI];
  pMVar6 = in_RDI;
  pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
  dVar3 = pdVar5[in_EDX];
  bVar4 = false;
  __x = (int)pMVar6;
  std::abs(__x);
  std::abs(__x);
  if (in_XMM0_Qa * extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
    local_70 = (dVar9 + dVar3) / (dVar1 - dVar2);
    local_78 = sqrt(local_70 * local_70 + 1.0);
    local_78 = 1.0 / local_78;
    if (local_70 < 0.0) {
      local_78 = -local_78;
    }
    local_70 = local_78 * local_70;
    local_60 = local_78 * (dVar1 + dVar2) + local_70 * (dVar3 - dVar9);
    local_68 = (local_70 * dVar1 + -(local_78 * dVar3)) * 2.0;
    bVar4 = true;
  }
  else {
    local_70 = 1.0;
    local_78 = 0.0;
    local_60 = dVar3 - dVar9;
    local_68 = dVar1 + dVar2;
  }
  std::abs(__x);
  pMVar6 = extraout_XMM0_Qa_01;
  std::abs(__x);
  if (in_XMM0_Qa * extraout_XMM0_Qa_02 < (double)pMVar6) {
    local_60 = local_60 / local_68;
    std::abs(__x);
    in_stack_fffffffffffffed8 = extraout_XMM0_Qa_03;
    dVar7 = sqrt(local_60 * local_60 + 1.0);
    local_b0 = 1.0 / (in_stack_fffffffffffffed8 + dVar7);
    if (local_60 < 0.0) {
      local_b0 = -local_b0;
    }
    local_98 = sqrt(local_b0 * local_b0 + 1.0);
    local_98 = 1.0 / local_98;
    local_a0 = local_98 * local_b0;
    bVar4 = true;
  }
  else {
    local_98 = 1.0;
    local_a0 = 0.0;
  }
  dVar7 = local_98 * local_70 + -(local_a0 * local_78);
  dVar8 = local_a0 * local_70 + local_98 * local_78;
  if (bVar4) {
    s_00 = dVar7 * (dVar9 * local_98 + -(dVar1 * local_a0)) +
           -(dVar8 * (dVar2 * local_98 + -(dVar3 * local_a0)));
    dVar9 = dVar8 * (dVar9 * local_a0 + dVar1 * local_98) +
            dVar7 * (dVar2 * local_a0 + dVar3 * local_98);
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
    pdVar5[in_ESI] = s_00;
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
    pdVar5[in_EDX] = dVar9;
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
    pdVar5[in_ESI] = 0.0;
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
    pdVar5[in_EDX] = 0.0;
    for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
      if ((local_d4 != in_ESI) && (local_d4 != in_EDX)) {
        pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
        dVar1 = pdVar5[local_d4];
        pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
        dVar2 = pdVar5[local_d4];
        pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
        pdVar5[local_d4] = dVar7 * dVar1 + -(dVar8 * dVar2);
        pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
        pdVar5[local_d4] = dVar8 * dVar1 + dVar7 * dVar2;
      }
    }
    for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
      if ((local_ec != in_ESI) && (local_ec != in_EDX)) {
        pdVar5 = Matrix44<double>::operator[](in_RDI,local_ec);
        dVar1 = pdVar5[in_ESI];
        pdVar5 = Matrix44<double>::operator[](in_RDI,local_ec);
        dVar2 = pdVar5[in_EDX];
        pdVar5 = Matrix44<double>::operator[](in_RDI,local_ec);
        pdVar5[in_ESI] = local_98 * dVar1 + -(local_a0 * dVar2);
        pdVar5 = Matrix44<double>::operator[](in_RDI,local_ec);
        pdVar5[in_EDX] = local_a0 * dVar1 + local_98 * dVar2;
      }
    }
    jacobiRotateRight<double>
              (pMVar6,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               SUB84(in_stack_fffffffffffffed8,0),dVar9,s_00);
    jacobiRotateRight<double>
              (pMVar6,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               SUB84(in_stack_fffffffffffffed8,0),dVar9,s_00);
    local_1 = true;
  }
  else {
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_EDX);
    pdVar5[in_ESI] = 0.0;
    pdVar5 = Matrix44<double>::operator[](in_RDI,in_ESI);
    pdVar5[in_EDX] = 0.0;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
twoSidedJacobiRotation (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                        int j,
                        int k,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
                        const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))  // Already symmetric (to tolerance)
    {                                          // Note that the <= is important here
        c = T(1);                              // because we want to bypass the computation
        s = T(0);                              // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1 = r - p;
        mu_2 = x + y;
    }
    else
    {
        const T rho = mu_1 / mu_2;
        s = T(1) / std::sqrt (T(1) + rho*rho);  // TODO is there a native inverse square root function?
        if (rho < 0)
            s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w);   // = r - p
        mu_2 = T(2) * (c * x - s * z);      // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))
    {
       c_2 = T(1);
       s_2 = T(0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T(1) / (std::abs(rho_2) + std::sqrt(1 + rho_2*rho_2));
        if (rho_2 < 0)
            t_2 = -t_2;
        c_2 = T(1) / std::sqrt (T(1) + t_2*t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1*(w*c_2 - x*s_2) - s_1*(y*c_2 - z*s_2);
    const T d_2 = s_1*(w*s_2 + x*c_2) + c_1*(y*s_2 + z*c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.  
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    for (int l = 0; l < 4; ++l)
    {
        if (l == j || l == k)
            continue;

        // Rotate on the left by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.  
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l] = c_1 * tau1 - s_1 * tau2;
        A[k][l] = s_1 * tau1 + c_1 * tau2;
    }

    for (int l = 0; l < 4; ++l)
    {
        // We set the A[j/k][j/k] entries already
        if (l == j || l == k)
            continue;

        // Rotate on the right by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.  
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j] = c_2 * tau1 - s_2 * tau2;
        A[l][k] = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have 
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight (U, j, k, c_1, s_1);
    jacobiRotateRight (V, j, k, c_2, s_2);

    return true;
}